

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYs<int>,_ImPlot::TransformerLogLog>
::operator()(ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYs<int>,_ImPlot::TransformerLogLog>
             *this,ImDrawList *DrawList,ImRect *param_2,ImVec2 *uv,int prim)

{
  float fVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  GetterXsYs<int> *pGVar8;
  TransformerLogLog *pTVar9;
  ImPlotPlot *pIVar10;
  ImDrawVert *pIVar11;
  uint *puVar12;
  ImVec2 IVar13;
  double dVar14;
  double dVar15;
  ImVec2 IVar16;
  ImPlotContext *pIVar17;
  ImPlotContext *pIVar18;
  uint uVar19;
  long lVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  
  pIVar17 = GImPlot;
  pGVar8 = this->Getter1;
  pTVar9 = this->Transformer;
  iVar7 = pGVar8->Count;
  lVar20 = (long)(((pGVar8->Offset + prim + 1) % iVar7 + iVar7) % iVar7) * (long)pGVar8->Stride;
  iVar7 = *(int *)((long)pGVar8->Ys + lVar20);
  dVar14 = log10((double)*(int *)((long)pGVar8->Xs + lVar20) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar3 = pIVar17->LogDenX;
  pIVar10 = pIVar17->CurrentPlot;
  dVar4 = (pIVar10->XAxis).Range.Min;
  dVar5 = (pIVar10->XAxis).Range.Max;
  dVar15 = log10((double)iVar7 / pIVar10->YAxis[pTVar9->YAxis].Range.Min);
  pIVar18 = GImPlot;
  iVar7 = pTVar9->YAxis;
  pIVar10 = pIVar17->CurrentPlot;
  dVar6 = pIVar10->YAxis[iVar7].Range.Min;
  fVar24 = (float)((((double)(float)(dVar14 / dVar3) * (dVar5 - dVar4) + dVar4) -
                   (pIVar10->XAxis).Range.Min) * pIVar17->Mx +
                  (double)pIVar17->PixelRange[iVar7].Min.x);
  fVar22 = (float)((((double)(float)(dVar15 / pIVar17->LogDenY[iVar7]) *
                     (pIVar10->YAxis[iVar7].Range.Max - dVar6) + dVar6) - dVar6) *
                   pIVar17->My[iVar7] + (double)pIVar17->PixelRange[iVar7].Min.y);
  pGVar8 = this->Getter2;
  pTVar9 = this->Transformer;
  iVar7 = pGVar8->Count;
  lVar20 = (long)(((prim + 1 + pGVar8->Offset) % iVar7 + iVar7) % iVar7) * (long)pGVar8->Stride;
  iVar7 = *(int *)((long)pGVar8->Ys + lVar20);
  dVar14 = log10((double)*(int *)((long)pGVar8->Xs + lVar20) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar3 = pIVar18->LogDenX;
  pIVar10 = pIVar18->CurrentPlot;
  dVar4 = (pIVar10->XAxis).Range.Min;
  dVar5 = (pIVar10->XAxis).Range.Max;
  dVar15 = log10((double)iVar7 / pIVar10->YAxis[pTVar9->YAxis].Range.Min);
  iVar7 = pTVar9->YAxis;
  pIVar10 = pIVar18->CurrentPlot;
  dVar6 = pIVar10->YAxis[iVar7].Range.Min;
  fVar21 = (float)((((double)(float)(dVar14 / dVar3) * (dVar5 - dVar4) + dVar4) -
                   (pIVar10->XAxis).Range.Min) * pIVar18->Mx +
                  (double)pIVar18->PixelRange[iVar7].Min.x);
  fVar26 = (float)((((double)(float)(dVar15 / pIVar18->LogDenY[iVar7]) *
                     (pIVar10->YAxis[iVar7].Range.Max - dVar6) + dVar6) - dVar6) *
                   pIVar18->My[iVar7] + (double)pIVar18->PixelRange[iVar7].Min.y);
  fVar23 = (this->P12).x;
  fVar25 = fVar23 - fVar21;
  fVar28 = (this->P11).x;
  fVar1 = (this->P11).y;
  fVar2 = (this->P12).y;
  fVar29 = fVar28 * fVar22 - fVar24 * fVar1;
  fVar23 = fVar23 * fVar26 - fVar21 * fVar2;
  fVar28 = fVar28 - fVar24;
  fVar27 = fVar28 * (fVar2 - fVar26) - fVar25 * (fVar1 - fVar22);
  DrawList->_VtxWritePtr->pos = this->P11;
  DrawList->_VtxWritePtr->uv = *uv;
  pIVar11 = DrawList->_VtxWritePtr;
  pIVar11->col = this->Col;
  pIVar11[1].pos.x = fVar24;
  pIVar11[1].pos.y = fVar22;
  DrawList->_VtxWritePtr[1].uv = *uv;
  pIVar11 = DrawList->_VtxWritePtr;
  pIVar11[1].col = this->Col;
  IVar16.y = ((fVar2 - fVar26) * fVar29 - (fVar1 - fVar22) * fVar23) / fVar27;
  IVar16.x = (fVar29 * fVar25 - fVar28 * fVar23) / fVar27;
  pIVar11[2].pos = IVar16;
  DrawList->_VtxWritePtr[2].uv = *uv;
  pIVar11 = DrawList->_VtxWritePtr;
  pIVar11[2].col = this->Col;
  pIVar11[3].pos = this->P12;
  DrawList->_VtxWritePtr[3].uv = *uv;
  pIVar11 = DrawList->_VtxWritePtr;
  pIVar11[3].col = this->Col;
  IVar13.y = fVar26;
  IVar13.x = fVar21;
  pIVar11[4].pos = IVar13;
  DrawList->_VtxWritePtr[4].uv = *uv;
  pIVar11 = DrawList->_VtxWritePtr;
  pIVar11[4].col = this->Col;
  DrawList->_VtxWritePtr = pIVar11 + 5;
  puVar12 = DrawList->_IdxWritePtr;
  *puVar12 = DrawList->_VtxCurrentIdx;
  uVar19 = -(uint)(fVar2 < fVar1 && fVar22 < fVar26 || fVar1 < fVar2 && fVar26 < fVar22) & 1;
  puVar12[1] = DrawList->_VtxCurrentIdx + uVar19 + 1;
  puVar12[2] = DrawList->_VtxCurrentIdx + 3;
  puVar12[3] = DrawList->_VtxCurrentIdx + 1;
  puVar12[4] = (uVar19 ^ 3) + DrawList->_VtxCurrentIdx;
  puVar12[5] = DrawList->_VtxCurrentIdx + 4;
  DrawList->_IdxWritePtr = puVar12 + 6;
  DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 5;
  (this->P11).x = fVar24;
  (this->P11).y = fVar22;
  (this->P12).x = fVar21;
  (this->P12).y = fVar26;
  return true;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& /*cull_rect*/, const ImVec2& uv, int prim) const {
        // TODO: Culling
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }